

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_time.cc
# Opt level: O3

void __thiscall CSocekt::AddToTimerQueue(CSocekt *this,lp_connection_t pConn)

{
  int iVar1;
  CMemory *this_00;
  time_t tVar2;
  pair<long,__STRUC_MSG_HEADER_*> local_40;
  
  this_00 = CMemory::GetInstance();
  tVar2 = time((time_t *)0x0);
  iVar1 = this->m_iWaitTime;
  muduo::MutexLock::lock(&this->m_timequeueMutex);
  local_40.second =
       (_STRUC_MSG_HEADER *)CMemory::AllocMemory(this_00,(int)this->m_iLenMsgHeader,false);
  local_40.first = tVar2 + iVar1;
  (local_40.second)->pConn = pConn;
  (local_40.second)->iCurrsequence = pConn->iCurrsequence;
  std::
  _Rb_tree<long,std::pair<long_const,_STRUC_MSG_HEADER*>,std::_Select1st<std::pair<long_const,_STRUC_MSG_HEADER*>>,std::less<long>,std::allocator<std::pair<long_const,_STRUC_MSG_HEADER*>>>
  ::_M_emplace_equal<std::pair<long,_STRUC_MSG_HEADER*>>
            ((_Rb_tree<long,std::pair<long_const,_STRUC_MSG_HEADER*>,std::_Select1st<std::pair<long_const,_STRUC_MSG_HEADER*>>,std::less<long>,std::allocator<std::pair<long_const,_STRUC_MSG_HEADER*>>>
              *)&this->m_timerQueuemap,&local_40);
  this->m_cur_size_ = this->m_cur_size_ + 1;
  this->m_timer_value_ =
       *(time_t *)((this->m_timerQueuemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1)
  ;
  (this->m_timequeueMutex).holder_ = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_timequeueMutex);
  return;
}

Assistant:

void CSocekt::AddToTimerQueue(lp_connection_t pConn)
{
    CMemory *p_memory = CMemory::GetInstance();

    time_t futtime = time(NULL);  //记录当前时间
    futtime += m_iWaitTime;  //20秒之后的时间

    muduo::MutexLockGuard lock(m_timequeueMutex); //互斥，因为要操作m_timeQueuemap了
    LPSTRUC_MSG_HEADER tmpMsgHeader = (LPSTRUC_MSG_HEADER)p_memory->AllocMemory(m_iLenMsgHeader,false);
    tmpMsgHeader->pConn = pConn;
    tmpMsgHeader->iCurrsequence = pConn->iCurrsequence;
    m_timerQueuemap.insert(std::make_pair(futtime,tmpMsgHeader)); //按键 自动排序 小->大
    m_cur_size_++;  //计时队列尺寸+1
    m_timer_value_ = GetEarliestTime(); //计时队列头部时间值保存到m_timer_value_里
      
}